

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int StopThreadHokuyox(HOKUYO *pHokuyo)

{
  int local_1c;
  int id;
  HOKUYO *pHokuyo_local;
  
  local_1c = 0;
  do {
    if ((HOKUYO *)addrsHokuyo[local_1c] == pHokuyo) {
      bExitHokuyo[local_1c] = 1;
      WaitForThread(HokuyoThreadId[local_1c]);
      DeleteCriticalSection(HokuyoCS + local_1c);
      resHokuyo[local_1c] = 1;
      return 0;
    }
    local_1c = local_1c + 1;
  } while (local_1c < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int StopThreadHokuyox(HOKUYO* pHokuyo)
{
	int id = 0;

	while (addrsHokuyo[id] != pHokuyo)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	bExitHokuyo[id] = TRUE;
	WaitForThread(HokuyoThreadId[id]);
	DeleteCriticalSection(&HokuyoCS[id]);
	resHokuyo[id] = EXIT_FAILURE;
	return EXIT_SUCCESS;
}